

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_logger.cpp
# Opt level: O3

void __thiscall LoaderLogger::RemoveLogRecorder(LoaderLogger *this,uint64_t unique_id)

{
  pointer puVar1;
  LoaderLogRecorder *pLVar2;
  LoaderLogRecorder *pLVar3;
  _Hash_node_base *p_Var4;
  pointer __p;
  pointer puVar5;
  const_iterator cVar6;
  pointer puVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  iterator __first;
  unique_lock<std::shared_timed_mutex> lock;
  uint64_t local_48;
  unique_lock<std::shared_timed_mutex> local_40;
  
  local_40._M_owns = false;
  local_48 = unique_id;
  local_40._M_device = &this->_mutex;
  std::unique_lock<std::shared_timed_mutex>::lock(&local_40);
  local_40._M_owns = true;
  puVar5 = (this->_recorders).
           super__Vector_base<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>,_std::allocator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->_recorders).
           super__Vector_base<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>,_std::allocator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar8 = (long)puVar1 - (long)puVar5;
  puVar7 = puVar5;
  uVar10 = uVar8;
  if (0 < (long)uVar8 >> 5) {
    puVar7 = (pointer)((long)&(puVar5->_M_t).
                              super___uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>
                              .super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl +
                      (uVar8 & 0xffffffffffffffe0));
    lVar9 = ((long)uVar8 >> 5) + 1;
    __first._M_current = puVar5 + 2;
    do {
      if ((__first._M_current[-2]._M_t.
           super___uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>._M_t.
           super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>.
           super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl)->_unique_id == unique_id)
      {
        __first._M_current = __first._M_current + -2;
        goto LAB_00112b58;
      }
      if ((__first._M_current[-1]._M_t.
           super___uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>._M_t.
           super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>.
           super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl)->_unique_id == unique_id)
      {
        __first._M_current = __first._M_current + -1;
        goto LAB_00112b58;
      }
      if ((((__first._M_current)->_M_t).
           super___uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>._M_t.
           super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>.
           super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl)->_unique_id == unique_id)
      goto LAB_00112b58;
      if ((__first._M_current[1]._M_t.
           super___uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>._M_t.
           super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>.
           super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl)->_unique_id == unique_id)
      {
        __first._M_current = __first._M_current + 1;
        goto LAB_00112b58;
      }
      lVar9 = lVar9 + -1;
      __first._M_current = __first._M_current + 4;
    } while (1 < lVar9);
    uVar10 = (long)puVar1 - (long)puVar7;
  }
  lVar9 = (long)uVar10 >> 3;
  if (lVar9 == 1) {
LAB_00112b38:
    __first._M_current = puVar7;
    if (((puVar7->_M_t).
         super___uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>._M_t.
         super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>.
         super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl)->_unique_id != unique_id) {
      __first._M_current = puVar1;
    }
  }
  else if (lVar9 == 2) {
LAB_00112b2b:
    __first._M_current = puVar7;
    if (((puVar7->_M_t).
         super___uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>._M_t.
         super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>.
         super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl)->_unique_id != unique_id) {
      puVar7 = puVar7 + 1;
      goto LAB_00112b38;
    }
  }
  else {
    __first._M_current = puVar1;
    if (lVar9 != 3) goto LAB_00112bac;
    __first._M_current = puVar7;
    if (((puVar7->_M_t).
         super___uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>._M_t.
         super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>.
         super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl)->_unique_id != unique_id) {
      puVar7 = puVar7 + 1;
      goto LAB_00112b2b;
    }
  }
LAB_00112b58:
  puVar7 = __first._M_current + 1;
  if (puVar7 != puVar1 && __first._M_current != puVar1) {
    do {
      pLVar2 = (puVar7->_M_t).
               super___uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>.
               _M_t.
               super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>.
               super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl;
      if (pLVar2->_unique_id != unique_id) {
        (puVar7->_M_t).
        super___uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>._M_t.
        super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>.
        super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl = (LoaderLogRecorder *)0x0;
        pLVar3 = ((__first._M_current)->_M_t).
                 super___uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>
                 .super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl;
        ((__first._M_current)->_M_t).
        super___uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>._M_t.
        super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>.
        super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl = pLVar2;
        if (pLVar3 != (LoaderLogRecorder *)0x0) {
          (*pLVar3->_vptr_LoaderLogRecorder[1])();
        }
        __first._M_current = __first._M_current + 1;
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar1);
    puVar5 = (this->_recorders).
             super__Vector_base<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>,_std::allocator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = (long)puVar1 - (long)puVar5;
  }
LAB_00112bac:
  std::
  vector<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>,_std::allocator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_>_>
  ::_M_erase(&this->_recorders,__first,
             (unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *)
             ((long)&(puVar5->_M_t).
                     super___uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>
                     .super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl + uVar8));
  for (p_Var4 = (this->_recordersByInstance)._M_h._M_before_begin._M_nxt;
      p_Var4 != (_Hash_node_base *)0x0; p_Var4 = p_Var4->_M_nxt) {
    cVar6 = std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)(p_Var4 + 2),&local_48);
    if (cVar6.super__Node_iterator_base<unsigned_long,_false>._M_cur != (__node_type *)0x0) {
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_erase((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)(p_Var4 + 2),&local_48);
    }
  }
  std::unique_lock<std::shared_timed_mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void LoaderLogger::RemoveLogRecorder(uint64_t unique_id) {
    std::unique_lock<std::shared_timed_mutex> lock(_mutex);
    vector_remove_if_and_erase(
        _recorders, [=](std::unique_ptr<LoaderLogRecorder> const& recorder) { return recorder->UniqueId() == unique_id; });
    for (auto& recorders : _recordersByInstance) {
        auto& messengersForInstance = recorders.second;
        if (messengersForInstance.count(unique_id) > 0) {
            messengersForInstance.erase(unique_id);
        }
    }
}